

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::Mirror(BoardView *this)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  bool bVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pAVar11;
  long in_RDI;
  Annotation *ann;
  iterator __end1_4;
  iterator __begin1_4;
  vector<Annotation,_std::allocator<Annotation>_> *__range1_4;
  size_t i_1;
  size_t i;
  shared_ptr<Component> *part;
  iterator __end1_3;
  iterator __begin1_3;
  SharedVector<Component> *__range1_3;
  shared_ptr<Pin> *p_2;
  iterator __end1_2;
  iterator __begin1_2;
  SharedVector<Pin> *__range1_2;
  shared_ptr<Point> *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  SharedVector<Point> *__range1_1;
  shared_ptr<Point> *p;
  iterator __end1;
  iterator __begin1;
  SharedVector<Point> *__range1;
  ImVec2 max;
  ImVec2 min;
  SharedVector<Point> *outline;
  vector<Annotation,_std::allocator<Annotation>_> *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_> local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  reference local_a0;
  shared_ptr<Component> *local_98;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_90;
  undefined8 local_88;
  reference local_80;
  shared_ptr<Pin> *local_78;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_70;
  undefined8 local_68;
  reference local_60;
  shared_ptr<Point> *local_58;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_50;
  undefined8 local_48;
  reference local_40;
  shared_ptr<Point> *local_38;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_30;
  undefined8 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  undefined8 local_10;
  
  local_10 = (**(code **)(**(long **)(in_RDI + 8) + 0x28))();
  ImVec2::ImVec2(&local_18);
  ImVec2::ImVec2(&local_20);
  local_18.y = 3.4028235e+38;
  local_18.x = 3.4028235e+38;
  local_20.y = 1.1754944e-38;
  local_20.x = 1.1754944e-38;
  local_28 = local_10;
  local_30._M_current =
       (shared_ptr<Point> *)
       std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                 ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                  in_stack_fffffffffffffee8);
  local_38 = (shared_ptr<Point> *)
             std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                       ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                        in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
               ::operator*(&local_30);
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128706);
    if (peVar5->x < local_18.x) {
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x128725);
      local_18.x = peVar5->x;
    }
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x12873f);
    if (peVar5->y < local_18.y) {
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x12875f);
      local_18.y = peVar5->y;
    }
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x12877a);
    if (local_20.x < peVar5->x) {
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x128795);
      local_20.x = peVar5->x;
    }
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1287af);
    if (local_20.y < peVar5->y) {
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x1287cb);
      local_20.y = peVar5->y;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
    ::operator++(&local_30);
  }
  local_48 = local_10;
  local_50._M_current =
       (shared_ptr<Point> *)
       std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                 ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                  in_stack_fffffffffffffee8);
  local_58 = (shared_ptr<Point> *)
             std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                       ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                        in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_60 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
               ::operator*(&local_50);
    fVar2 = local_20.x;
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128873);
    fVar1 = peVar5->x;
    peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128890);
    peVar5->x = fVar2 - fVar1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
    ::operator++(&local_50);
  }
  local_68 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
  local_70._M_current =
       (shared_ptr<Pin> *)
       std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                 ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                  in_stack_fffffffffffffee8);
  local_78 = (shared_ptr<Pin> *)
             std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                       ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                        in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_80 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
               ::operator*(&local_70);
    fVar2 = local_20.x;
    peVar6 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128939);
    fVar1 = (peVar6->position).x;
    peVar6 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128957);
    (peVar6->position).x = fVar2 - fVar1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
    ::operator++(&local_70);
  }
  local_88 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  local_90._M_current =
       (shared_ptr<Component> *)
       std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::begin
                 ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   *)in_stack_fffffffffffffee8);
  local_98 = (shared_ptr<Component> *)
             std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
             end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_a0 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
               ::operator*(&local_90);
    fVar2 = local_20.x;
    peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1289fe);
    fVar1 = (peVar7->centerpoint).x;
    peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128a1c);
    (peVar7->centerpoint).x = fVar2 - fVar1;
    peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x128a34);
    if ((peVar7->outline_done & 1U) != 0) {
      local_a8 = 0;
      while( true ) {
        uVar3 = local_a8;
        peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x128a5e);
        sVar8 = std::array<ImVec2,_4UL>::size(&peVar7->outline);
        fVar1 = local_20.x;
        if (sVar8 <= uVar3) break;
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x128a90);
        pvVar9 = std::array<ImVec2,_4UL>::operator[]
                           ((array<ImVec2,_4UL> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (size_type)in_stack_fffffffffffffee8);
        fVar2 = pvVar9->x;
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x128abb);
        pvVar9 = std::array<ImVec2,_4UL>::operator[]
                           ((array<ImVec2,_4UL> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (size_type)in_stack_fffffffffffffee8);
        pvVar9->x = fVar1 - fVar2;
        local_a8 = local_a8 + 1;
      }
    }
    local_b0 = 0;
    while( true ) {
      uVar3 = local_b0;
      peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x128b08);
      sVar8 = std::vector<ImVec2,_std::allocator<ImVec2>_>::size(&peVar7->hull);
      if (sVar8 <= uVar3) break;
      in_stack_fffffffffffffef0 = local_20.x;
      peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x128b3d);
      pvVar10 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[](&peVar7->hull,local_b0);
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffef0 - pvVar10->x;
      peVar7 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x128b6b);
      pvVar10 = std::vector<ImVec2,_std::allocator<ImVec2>_>::operator[](&peVar7->hull,local_b0);
      pvVar10->x = in_stack_fffffffffffffef4;
      local_b0 = local_b0 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
    ::operator++(&local_90);
  }
  local_b8 = in_RDI + 0xd1f8;
  local_c0._M_current =
       (Annotation *)
       std::vector<Annotation,_std::allocator<Annotation>_>::begin(in_stack_fffffffffffffee8);
  std::vector<Annotation,_std::allocator<Annotation>_>::end(in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    pAVar11 = __gnu_cxx::
              __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
              ::operator*(&local_c0);
    pAVar11->x = (double)local_20.x - pAVar11->x;
    __gnu_cxx::
    __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>::
    operator++(&local_c0);
  }
  return;
}

Assistant:

void BoardView::Mirror(void) {
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (auto &p : outline) {
		p->x = max.x - p->x;
	}

	for (auto &p : m_board->Pins()) {
		//	auto p        = pin.get();
		p->position.x = max.x - p->position.x;
	}

	for (auto &part : m_board->Components()) {

		part->centerpoint.x = max.x - part->centerpoint.x;

		if (part->outline_done) {
			for (size_t i = 0; i < part->outline.size(); i++) {
				part->outline[i].x = max.x - part->outline[i].x;
			}
		}

		for (size_t i = 0; i < part->hull.size(); i++) {
			part->hull[i].x = max.x - part->hull[i].x;
		}
	}

	for (auto &ann : m_annotations.annotations) {
		ann.x = max.x - ann.x;
	}
}